

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_3b15::do_free(void *p)

{
  std::mutex::lock((mutex *)(anonymous_namespace)::allocate_lock);
  LOCK();
  (anonymous_namespace)::free_count = (anonymous_namespace)::free_count + 1;
  UNLOCK();
  free(p);
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::allocate_lock);
  return;
}

Assistant:

void do_free(void* p) {
  std::lock_guard l{allocate_lock};

  free_count++;
  free(p);
}